

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  model_name mVar1;
  element_type *peVar2;
  int32_t iVar3;
  int64_t iVar4;
  long lVar5;
  float lr;
  real rVar6;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  State state;
  ifstream ifs;
  
  std::ifstream::ifstream
            (&ifs,(string *)
                  &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->input,_S_in);
  iVar4 = utils::size(&ifs);
  utils::seek(&ifs,(iVar4 * threadId) /
                   (long)((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         thread);
  iVar3 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dim
  ;
  iVar4 = Matrix::size((this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  Model::State::State(&state,iVar3,(int32_t)iVar4,
                      ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->seed + threadId);
  iVar4 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar5 = 0;
  do {
    if ((((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         epoch * iVar4 <= (this->tokenCount_).super___atomic_base<long>._M_i) ||
       ((this->trainException_)._M_exception_object != (void *)0x0)) {
      if (threadId == 0) {
        rVar6 = Model::State::getLoss(&state);
        LOCK();
        (this->loss_)._M_i = rVar6;
        UNLOCK();
      }
      std::ifstream::close();
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&labels.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&line.super__Vector_base<int,_std::allocator<int>_>);
      Model::State::~State(&state);
      std::ifstream::~ifstream(&ifs);
      return;
    }
    peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lr = (float)((1.0 - (double)((float)(this->tokenCount_).super___atomic_base<long>._M_i /
                                (float)(peVar2->epoch * iVar4))) * peVar2->lr);
    mVar1 = peVar2->model;
    if (mVar1 == cbow) {
      iVar3 = Dictionary::getLine((this->dict_).
                                  super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(istream *)&ifs,&line,&state.rng);
      cbow(this,&state,lr,&line);
LAB_0013ab75:
      lVar5 = lVar5 + iVar3;
    }
    else {
      if (mVar1 == sg) {
        iVar3 = Dictionary::getLine((this->dict_).
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(istream *)&ifs,&line,&state.rng);
        skipgram(this,&state,lr,&line);
        goto LAB_0013ab75;
      }
      if (mVar1 == sup) {
        iVar3 = Dictionary::getLine((this->dict_).
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(istream *)&ifs,&line,&labels);
        supervised(this,&state,lr,&line,&labels);
        goto LAB_0013ab75;
      }
    }
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        lrUpdateRate < lVar5) {
      LOCK();
      (this->tokenCount_).super___atomic_base<long>._M_i =
           (this->tokenCount_).super___atomic_base<long>._M_i + lVar5;
      UNLOCK();
      lVar5 = 0;
      if ((threadId == 0) &&
         (lVar5 = 0,
         1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             verbose)) {
        rVar6 = Model::State::getLoss(&state);
        LOCK();
        (this->loss_)._M_i = rVar6;
        UNLOCK();
        lVar5 = 0;
      }
    }
  } while( true );
}

Assistant:

void FastText::trainThread(int32_t threadId) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model::State state(args_->dim, output_->size(0), threadId + args_->seed);

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  try {
    while (keepTraining(ntokens)) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      real lr = args_->lr * (1.0 - progress);
      if (args_->model == model_name::sup) {
        localTokenCount += dict_->getLine(ifs, line, labels);
        supervised(state, lr, line, labels);
      } else if (args_->model == model_name::cbow) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        cbow(state, lr, line);
      } else if (args_->model == model_name::sg) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        skipgram(state, lr, line);
      }
      if (localTokenCount > args_->lrUpdateRate) {
        tokenCount_ += localTokenCount;
        localTokenCount = 0;
        if (threadId == 0 && args_->verbose > 1) {
          loss_ = state.getLoss();
        }
      }
    }
  } catch (DenseMatrix::EncounteredNaNError&) {
    trainException_ = std::current_exception();
  }
  if (threadId == 0)
    loss_ = state.getLoss();
  ifs.close();
}